

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

int __thiscall
re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Thread *pTVar5;
  Inst *pIVar6;
  char *pcVar7;
  char **ppcVar8;
  char **ppcVar9;
  Inst *pIVar10;
  int in_EAX;
  uint uVar11;
  ostream *poVar12;
  int iVar13;
  IndexValue *pIVar14;
  ulong uVar15;
  IndexValue *pIVar16;
  bool bVar17;
  char *local_1e8;
  LogMessage local_1b0;
  
  nextq->size_ = 0;
  bVar17 = runq->size_ == 0;
  local_1e8._0_4_ = in_EAX;
  if (!bVar17) {
    pIVar14 = (runq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl;
    pcVar1 = p + -1;
    pIVar16 = pIVar14;
    local_1e8 = pcVar1;
    do {
      pTVar5 = pIVar16->value_;
      bVar2 = false;
      if (pTVar5 != (Thread *)0x0) {
        bVar2 = this->longest_;
        if (((bVar2 == true) && (this->matched_ == true)) && (*this->match_ < *pTVar5->capture)) {
          iVar13 = (pTVar5->field_0).ref;
          (pTVar5->field_0).ref = iVar13 + -1;
        }
        else {
          iVar13 = pIVar16->index_;
          pIVar6 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          uVar3 = pIVar6[iVar13].out_opcode_;
          uVar11 = uVar3 & 7;
          if (uVar11 == 1) {
            if (pIVar16 == pIVar14) {
              uVar11 = pIVar6[uVar3 >> 4].out_opcode_ & 7;
              if (uVar11 == 2) {
LAB_001cae13:
                iVar4 = this->ncapture_;
                if (0 < (long)iVar4) {
                  ppcVar8 = this->match_;
                  ppcVar9 = pTVar5->capture;
                  uVar15 = 0;
                  do {
                    ppcVar8[uVar15] = ppcVar9[uVar15];
                    ppcVar8[uVar15 + 1] = ppcVar9[uVar15 + 1];
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < (ulong)(long)iVar4);
                }
                this->matched_ = true;
                iVar4 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar4 + -1;
                pIVar14 = pIVar16;
                if (iVar4 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar5;
                }
                while (pIVar16 = pIVar14 + 1,
                      pIVar16 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar14[1].value_;
                  pIVar14 = pIVar16;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar4 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar4 + -1, iVar4 < 2))
                  {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                    this->free_threads_ = pTVar5;
                  }
                }
                runq->size_ = 0;
                local_1e8 = (char *)(ulong)(pIVar6[iVar13].out_opcode_ >> 4);
                pIVar10 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                          ((long)&(this->prog_->inst_).ptr_._M_t.
                                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          + 8))->_M_head_impl;
                uVar3 = pIVar10[(long)local_1e8].out_opcode_;
                uVar11 = uVar3 & 7;
                bVar2 = true;
                if ((uVar11 == 2) || ((uVar11 == 6 && ((pIVar10[uVar3 >> 4].out_opcode_ & 7) == 2)))
                   ) {
                  local_1e8 = (char *)(ulong)pIVar6[iVar13].field_1.out1_;
                }
                goto LAB_001cad21;
              }
              if (uVar11 == 6) {
                if ((pIVar6[pIVar6[uVar3 >> 4].out_opcode_ >> 4].out_opcode_ & 7) == 2 ||
                    bVar2 != false) goto LAB_001cae13;
              }
              else if (bVar2 != false) goto LAB_001cae13;
            }
          }
          else if (uVar11 == 2) {
            AddToThreadq(this,nextq,uVar3 >> 4,c,context,p,pTVar5);
          }
          else if (uVar11 == 5) {
            if ((p != (char *)0x0) && ((this->endmatch_ != true || (pcVar1 == this->etext_)))) {
              if (bVar2 == false) {
                iVar13 = this->ncapture_;
                if (0 < (long)iVar13) {
                  ppcVar8 = this->match_;
                  ppcVar9 = pTVar5->capture;
                  uVar15 = 0;
                  do {
                    ppcVar8[uVar15] = ppcVar9[uVar15];
                    ppcVar8[uVar15 + 1] = ppcVar9[uVar15 + 1];
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < (ulong)(long)iVar13);
                }
                this->match_[1] = pcVar1;
                this->matched_ = true;
                iVar13 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar13 + -1;
                pIVar14 = pIVar16;
                if (iVar13 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar5;
                }
                while (pIVar16 = pIVar14 + 1,
                      pIVar16 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar14[1].value_;
                  pIVar14 = pIVar16;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar13 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar13 + -1,
                     iVar13 < 2)) {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                    this->free_threads_ = pTVar5;
                  }
                }
                runq->size_ = 0;
                local_1e8 = (char *)0x0;
                bVar2 = true;
                goto LAB_001cad21;
              }
              if (this->matched_ == true) {
                pcVar7 = *this->match_;
                if ((pcVar7 <= *pTVar5->capture) &&
                   ((*pTVar5->capture != pcVar7 || (pcVar1 <= this->match_[1])))) goto LAB_001cad00;
              }
              iVar13 = this->ncapture_;
              if (0 < (long)iVar13) {
                ppcVar8 = this->match_;
                ppcVar9 = pTVar5->capture;
                uVar15 = 0;
                do {
                  ppcVar8[uVar15] = ppcVar9[uVar15];
                  ppcVar8[uVar15 + 1] = ppcVar9[uVar15 + 1];
                  uVar15 = uVar15 + 2;
                } while (uVar15 < (ulong)(long)iVar13);
              }
              this->match_[1] = pcVar1;
              this->matched_ = true;
            }
          }
          else {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                       ,0x167);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Unhandled ",10);
            poVar12 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)&local_1b0.str_,pIVar6[iVar13].out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," in step",8);
            LogMessage::~LogMessage(&local_1b0);
          }
LAB_001cad00:
          iVar13 = (pTVar5->field_0).ref;
          (pTVar5->field_0).ref = iVar13 + -1;
        }
        bVar2 = false;
        if (iVar13 < 2) {
          pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar5;
        }
      }
LAB_001cad21:
      if (bVar2) break;
      pIVar16 = pIVar16 + 1;
      pIVar14 = (runq->dense_).ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
                _M_head_impl;
      bVar17 = pIVar16 == pIVar14 + runq->size_;
    } while (!bVar17);
  }
  if (bVar17) {
    runq->size_ = 0;
    local_1e8._0_4_ = 0;
  }
  return (int)local_1e8;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior when p happens
        // to be null - and p-1 would be meaningless anyway.
        if (p == NULL)
          break;

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}